

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_ctx.c
# Opt level: O0

void BN_POOL_finish(BN_POOL *p)

{
  long *in_RDI;
  BIGNUM *bn;
  uint loop;
  BIGNUM *local_18;
  uint local_c;
  
  while (*in_RDI != 0) {
    local_c = 0;
    local_18 = (BIGNUM *)*in_RDI;
    while (local_c < 0x10) {
      if (local_18->d != (ulong *)0x0) {
        BN_clear_free(local_18);
      }
      local_18 = local_18 + 1;
      local_c = local_c + 1;
    }
    in_RDI[1] = *(long *)(*in_RDI + 0x188);
    CRYPTO_free((void *)*in_RDI);
    *in_RDI = in_RDI[1];
  }
  return;
}

Assistant:

static void BN_POOL_finish(BN_POOL *p)
{
    unsigned int loop;
    BIGNUM *bn;

    while (p->head) {
        for (loop = 0, bn = p->head->vals; loop++ < BN_CTX_POOL_SIZE; bn++)
            if (bn->d)
                BN_clear_free(bn);
        p->current = p->head->next;
        OPENSSL_free(p->head);
        p->head = p->current;
    }
}